

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::compute::anon_unknown_0::ImageAtomicOpTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageAtomicOpTestInstance *this)

{
  VkAllocationCallbacks **__return_storage_ptr___00;
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  RefData<vk::Handle<(vk::HandleType)13>_> data;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  RefData<vk::Handle<(vk::HandleType)14>_> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)18>_> data_05;
  RefData<vk::Handle<(vk::HandleType)24>_> data_06;
  RefData<vk::VkCommandBuffer_s_*> data_07;
  deUint32 queueFamilyIndex_00;
  int iVar3;
  uint uVar4;
  deUint32 dVar5;
  uint uVar6;
  uint uVar7;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  VkImage *pVVar8;
  Allocation *pAVar9;
  VkDeviceMemory VVar10;
  VkDeviceSize VVar11;
  DescriptorSetLayoutBuilder *pDVar12;
  DescriptorPoolBuilder *pDVar13;
  Handle<(vk::HandleType)21> *pHVar14;
  Handle<(vk::HandleType)19> *pHVar15;
  Handle<(vk::HandleType)13> *pHVar16;
  VkBuffer *pVVar17;
  Handle<(vk::HandleType)22> *pHVar18;
  DescriptorSetUpdateBuilder *pDVar19;
  ProgramCollection<vk::ProgramBinary> *this_00;
  ProgramBinary *binary;
  Handle<(vk::HandleType)16> *pHVar20;
  Handle<(vk::HandleType)14> *pHVar21;
  Handle<(vk::HandleType)24> *pHVar22;
  VkCommandBuffer_s **ppVVar23;
  Handle<(vk::HandleType)18> *pHVar24;
  void *pvVar25;
  void *pvVar26;
  ostream *this_01;
  allocator<char> local_aa9;
  string local_aa8;
  undefined4 local_a84;
  string local_a80;
  ostringstream local_a60 [8];
  ostringstream msg;
  uint local_8e8;
  int local_8e4;
  deUint32 offs;
  deUint32 ref;
  deUint32 res;
  deUint32 pixelNdx;
  deUint32 *refBufferPtr;
  deUint32 *bufferPtr;
  Allocation *outputBufferAllocation;
  Move<vk::VkCommandBuffer_s_*> local_890;
  RefData<vk::VkCommandBuffer_s_*> local_870;
  undefined1 local_850 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_810;
  undefined1 local_7f0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkBufferImageCopy copyParams;
  undefined1 local_790 [8];
  VkBufferMemoryBarrier outputBufferPostCopyBarrier;
  undefined1 local_730 [8];
  VkImageMemoryBarrier imagePreCopyBarrier;
  undefined1 local_6c0 [8];
  VkImageMemoryBarrier imageLayoutBarrier;
  undefined1 local_670 [8];
  VkBufferMemoryBarrier inputBufferPostHostWriteBarrier;
  Move<vk::Handle<(vk::HandleType)18>_> local_628;
  RefData<vk::Handle<(vk::HandleType)18>_> local_608;
  undefined1 local_5e8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_5c0;
  RefData<vk::Handle<(vk::HandleType)16>_> local_5a0;
  undefined1 local_580 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  string local_558;
  Move<vk::Handle<(vk::HandleType)14>_> local_538;
  RefData<vk::Handle<(vk::HandleType)14>_> local_518;
  undefined1 local_4f8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  Location local_4c8;
  VkDescriptorSet local_4c0;
  DescriptorSetUpdateBuilder local_4b8;
  deUint64 local_470;
  undefined1 local_468 [8];
  VkDescriptorBufferInfo bufferDescriptorInfo;
  VkSampler local_448;
  undefined1 local_440 [8];
  VkDescriptorImageInfo imageDescriptorInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_418;
  RefData<vk::Handle<(vk::HandleType)22>_> local_3f8;
  undefined1 local_3d8 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_3a0;
  RefData<vk::Handle<(vk::HandleType)21>_> local_380;
  undefined1 local_360 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_2f8;
  RefData<vk::Handle<(vk::HandleType)19>_> local_2d8;
  undefined1 local_2b8 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_290;
  undefined1 local_258 [8];
  Buffer outputBuffer;
  VkDeviceSize outputBufferSizeBytes;
  deUint32 imageArea;
  uint local_20c;
  deUint32 *pdStack_208;
  deUint32 i;
  deUint32 *bufferPtr_1;
  Allocation *inputBufferAllocation;
  Random rnd;
  undefined1 local_1a8 [8];
  Buffer inputBuffer;
  VkDeviceSize inputBufferSizeBytes;
  deUint32 numInputValues;
  Move<vk::Handle<(vk::HandleType)13>_> local_140;
  RefData<vk::Handle<(vk::HandleType)13>_> local_120;
  undefined1 local_100 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> imageView;
  VkImageSubresourceRange subresourceRange;
  Image image;
  VkImageCreateInfo imageParams;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  ImageAtomicOpTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator_00 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  __return_storage_ptr___00 =
       &image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  make2DImageCreateInfo((VkImageCreateInfo *)__return_storage_ptr___00,&this->m_imageSize,9);
  subresourceRange.baseArrayLayer = ::vk::MemoryRequirement::Any.m_flags;
  compute::Image::Image
            ((Image *)&subresourceRange.layerCount,vk_00,device_00,allocator_00,
             (VkImageCreateInfo *)__return_storage_ptr___00,::vk::MemoryRequirement::Any);
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)
             &imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator,1,
             0,1,0,1);
  pVVar8 = compute::Image::operator*((Image *)&subresourceRange.layerCount);
  subresourceRange_00.levelCount = subresourceRange.aspectMask;
  subresourceRange_00._0_8_ =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  subresourceRange_00.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = subresourceRange.levelCount;
  makeImageView(&local_140,vk_00,device_00,(VkImage)pVVar8->m_internal,VK_IMAGE_VIEW_TYPE_2D,
                VK_FORMAT_R32_UINT,subresourceRange_00);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data.deleter.m_deviceIface._0_4_ = (int)local_120.deleter.m_deviceIface;
  data.object.m_internal = local_120.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_120.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_120.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_120.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_120.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_120.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_100,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_140);
  iVar3 = compute::(anonymous_namespace)::multiplyComponents<int,2>(&this->m_imageSize);
  uVar4 = iVar3 * this->m_localSize;
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)((ulong)uVar4 << 2);
  makeBufferCreateInfo
            ((VkBufferCreateInfo *)&rnd.m_rnd.w,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,0x20);
  rnd.m_rnd.z = ::vk::MemoryRequirement::HostVisible.m_flags;
  compute::Buffer::Buffer
            ((Buffer *)local_1a8,vk_00,device_00,allocator_00,(VkBufferCreateInfo *)&rnd.m_rnd.w,
             ::vk::MemoryRequirement::HostVisible);
  de::Random::Random((Random *)((long)&inputBufferAllocation + 4),0x77238ac2);
  pAVar9 = compute::Buffer::getAllocation((Buffer *)local_1a8);
  pdStack_208 = (deUint32 *)::vk::Allocation::getHostPtr(pAVar9);
  for (local_20c = 0; local_20c < uVar4; local_20c = local_20c + 1) {
    dVar5 = de::Random::getUint32((Random *)((long)&inputBufferAllocation + 4));
    *pdStack_208 = dVar5;
    pdStack_208 = pdStack_208 + 1;
  }
  VVar10 = ::vk::Allocation::getMemory(pAVar9);
  VVar11 = ::vk::Allocation::getOffset(pAVar9);
  ::vk::flushMappedMemoryRange
            (vk_00,device_00,VVar10,VVar11,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  de::Random::~Random((Random *)((long)&inputBufferAllocation + 4));
  uVar4 = compute::(anonymous_namespace)::multiplyComponents<int,2>(&this->m_imageSize);
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)((ulong)uVar4 << 2);
  makeBufferCreateInfo
            (&local_290,
             (VkDeviceSize)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,2);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  compute::Buffer::Buffer
            ((Buffer *)local_258,vk_00,device_00,allocator_00,&local_290,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  pDVar12 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  pDVar12 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar12,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_2f8,pDVar12,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d8,(Move *)&local_2f8);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_2d8.deleter.m_deviceIface;
  data_00.object.m_internal = local_2d8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2d8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_2d8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_2d8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_2d8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_2d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2b8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_2f8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pDVar13 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar13 = ::vk::DescriptorPoolBuilder::addType(pDVar13,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build(&local_3a0,pDVar13,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_380,(Move *)&local_3a0);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_380.deleter.m_deviceIface;
  data_01.object.m_internal = local_380.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_380.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_380.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_380.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_380.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_380.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_360,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_3a0);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_360);
  descriptorPool_00.m_internal = pHVar14->m_internal;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2b8);
  imageDescriptorInfo._16_8_ = pHVar15->m_internal;
  makeDescriptorSet(&local_418,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)imageDescriptorInfo._16_8_);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3f8,(Move *)&local_418);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_3f8.deleter.m_deviceIface;
  data_02.object.m_internal = local_3f8.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3f8.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_3f8.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_3f8.deleter.m_device >> 0x20);
  data_02.deleter.m_pool.m_internal._0_4_ = (int)local_3f8.deleter.m_pool.m_internal;
  data_02.deleter.m_pool.m_internal._4_4_ = (int)(local_3f8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3d8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_418);
  ::vk::Handle<(vk::HandleType)20>::Handle(&local_448,0);
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_100);
  bufferDescriptorInfo.range = pHVar16->m_internal;
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_440,local_448,(VkImageView)bufferDescriptorInfo.range,
             VK_IMAGE_LAYOUT_GENERAL);
  pVVar17 = compute::Buffer::operator*((Buffer *)local_1a8);
  local_470 = pVVar17->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_468,(VkBuffer)local_470,0,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_4b8);
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3d8);
  local_4c0.m_internal = pHVar18->m_internal;
  local_4c8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pDVar19 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_4b8,local_4c0,&local_4c8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_468);
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3d8);
  destSet.m_internal = pHVar18->m_internal;
  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pDVar19 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar19,destSet,
                       (Location *)
                       &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                        m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                       (VkDescriptorImageInfo *)local_440);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar19,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_4b8);
  this_00 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"comp",
             (allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&local_558);
  ::vk::createShaderModule(&local_538,vk_00,device_00,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_518,(Move *)&local_538);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_518.deleter.m_deviceIface;
  data_03.object.m_internal = local_518.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_518.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_518.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_518.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_518.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_518.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_4f8,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_538);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2b8);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar15->m_internal;
  makePipelineLayout(&local_5c0,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5a0,(Move *)&local_5c0);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_5a0.deleter.m_deviceIface;
  data_04.object.m_internal = local_5a0.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5a0.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_5a0.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_5a0.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_5a0.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_5a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_580,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_5c0);
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_580);
  pipelineLayout_00.m_internal = pHVar20->m_internal;
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_4f8);
  inputBufferPostHostWriteBarrier.size = pHVar21->m_internal;
  makeComputePipeline(&local_628,vk_00,device_00,pipelineLayout_00,
                      (VkShaderModule)inputBufferPostHostWriteBarrier.size);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_608,(Move *)&local_628);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_608.deleter.m_deviceIface;
  data_05.object.m_internal = local_608.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_608.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_608.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_608.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_608.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_608.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5e8,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_628);
  pVVar17 = compute::Buffer::operator*((Buffer *)local_1a8);
  imageLayoutBarrier._64_8_ = pVVar17->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_670,0x4000,0x20,(VkBuffer)imageLayoutBarrier._64_8_,0,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  pVVar8 = compute::Image::operator*((Image *)&subresourceRange.layerCount);
  imagePreCopyBarrier._64_8_ =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  subresourceRange_01.levelCount = subresourceRange.aspectMask;
  subresourceRange_01._0_8_ =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  subresourceRange_01.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_01.layerCount = subresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_6c0,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_GENERAL,(VkImage)pVVar8->m_internal,subresourceRange_01);
  pVVar8 = compute::Image::operator*((Image *)&subresourceRange.layerCount);
  outputBufferPostCopyBarrier.size =
       (VkDeviceSize)
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  subresourceRange_02.levelCount = subresourceRange.aspectMask;
  subresourceRange_02._0_8_ =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  subresourceRange_02.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_02.layerCount = subresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_730,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)pVVar8->m_internal,subresourceRange_02);
  pVVar17 = compute::Buffer::operator*((Buffer *)local_258);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_790,0x1000,0x2000,(VkBuffer)pVVar17->m_internal,0,
             (VkDeviceSize)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  makeBufferImageCopy((VkBufferImageCopy *)
                      &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                       m_allocator,&this->m_imageSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,queueFamilyIndex_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_810,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_810.deleter.m_deviceIface;
  data_06.object.m_internal = local_810.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_810.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_810.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_810.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_810.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_810.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_7f0,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_7f0);
  ::vk::allocateCommandBuffer
            (&local_890,vk_00,device_00,(VkCommandPool)pHVar22->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_870,(Move *)&local_890);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_870.deleter.m_deviceIface;
  data_07.object = local_870.object;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_870.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_870.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_870.deleter.m_device >> 0x20);
  data_07.deleter.m_pool.m_internal._0_4_ = (int)local_870.deleter.m_pool.m_internal;
  data_07.deleter.m_pool.m_internal._4_4_ = (int)(local_870.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_850,data_07);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_890);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_850);
  beginCommandBuffer(vk_00,*ppVVar23);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_850);
  pVVar1 = *ppVVar23;
  pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_5e8);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,1,pHVar24->m_internal);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_850);
  pVVar1 = *ppVVar23;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_580);
  dVar2 = pHVar20->m_internal;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3d8);
  (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar1,1,dVar2,0,1,pHVar18,0,0);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_850);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar23,0x4000,0x800,0,0,0,1,(int)local_670,1,local_6c0);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_850);
  pVVar1 = *ppVVar23;
  uVar6 = tcu::Vector<int,_2>::x(&this->m_imageSize);
  uVar7 = tcu::Vector<int,_2>::y(&this->m_imageSize);
  (*vk_00->_vptr_DeviceInterface[0x5d])(vk_00,pVVar1,(ulong)uVar6,(ulong)uVar7,1);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_850);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar23,0x800,0x1000,0,0,0,0,0,1,local_730);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_850);
  pVVar1 = *ppVVar23;
  pVVar8 = compute::Image::operator*((Image *)&subresourceRange.layerCount);
  dVar2 = pVVar8->m_internal;
  pVVar17 = compute::Buffer::operator*((Buffer *)local_258);
  (*vk_00->_vptr_DeviceInterface[99])
            (vk_00,pVVar1,dVar2,6,pVVar17->m_internal,1,
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_850);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar23,0x1000,0x4000,0,0,0,1,(int)local_790,0,0);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_850);
  endCommandBuffer(vk_00,*ppVVar23);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_850);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar23);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_850);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_7f0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_580);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_4f8);
  pAVar9 = compute::Buffer::getAllocation((Buffer *)local_258);
  VVar10 = ::vk::Allocation::getMemory(pAVar9);
  VVar11 = ::vk::Allocation::getOffset(pAVar9);
  ::vk::invalidateMappedMemoryRange
            (vk_00,device_00,VVar10,VVar11,
             (VkDeviceSize)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  pvVar25 = ::vk::Allocation::getHostPtr(pAVar9);
  pAVar9 = compute::Buffer::getAllocation((Buffer *)local_1a8);
  pvVar26 = ::vk::Allocation::getHostPtr(pAVar9);
  ref = 0;
  do {
    if (uVar4 <= ref) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_aa8,"Compute succeeded",&local_aa9);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_aa8);
      std::__cxx11::string::~string((string *)&local_aa8);
      std::allocator<char>::~allocator(&local_aa9);
      local_a84 = 1;
LAB_00cf7fe5:
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3d8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_360);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2b8);
      compute::Buffer::~Buffer((Buffer *)local_258);
      compute::Buffer::~Buffer((Buffer *)local_1a8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_100);
      compute::Image::~Image((Image *)&subresourceRange.layerCount);
      return __return_storage_ptr__;
    }
    local_8e4 = 0;
    for (local_8e8 = 0; local_8e8 < this->m_localSize; local_8e8 = local_8e8 + 1) {
      local_8e4 = *(int *)((long)pvVar26 + (ulong)(ref * this->m_localSize + local_8e8) * 4) +
                  local_8e4;
    }
    if (*(int *)((long)pvVar25 + (ulong)ref * 4) != local_8e4) {
      std::__cxx11::ostringstream::ostringstream(local_a60);
      this_01 = std::operator<<((ostream *)local_a60,"Comparison failed for pixel ");
      std::ostream::operator<<(this_01,ref);
      std::__cxx11::ostringstream::str();
      tcu::TestStatus::fail(__return_storage_ptr__,&local_a80);
      std::__cxx11::string::~string((string *)&local_a80);
      local_a84 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_a60);
      goto LAB_00cf7fe5;
    }
    ref = ref + 1;
  } while( true );
}

Assistant:

tcu::TestStatus ImageAtomicOpTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Create an image

	const VkImageCreateInfo imageParams = make2DImageCreateInfo(m_imageSize, VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT);
	const Image image(vk, device, allocator, imageParams, MemoryRequirement::Any);

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Unique<VkImageView> imageView(makeImageView(vk, device, *image, VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_R32_UINT, subresourceRange));

	// Input buffer

	const deUint32 numInputValues = multiplyComponents(m_imageSize) * m_localSize;
	const VkDeviceSize inputBufferSizeBytes = sizeof(deUint32) * numInputValues;

	const Buffer inputBuffer(vk, device, allocator, makeBufferCreateInfo(inputBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Populate the input buffer with test data
	{
		de::Random rnd(0x77238ac2);
		const Allocation& inputBufferAllocation = inputBuffer.getAllocation();
		deUint32* bufferPtr = static_cast<deUint32*>(inputBufferAllocation.getHostPtr());
		for (deUint32 i = 0; i < numInputValues; ++i)
			*bufferPtr++ = rnd.getUint32();

		flushMappedMemoryRange(vk, device, inputBufferAllocation.getMemory(), inputBufferAllocation.getOffset(), inputBufferSizeBytes);
	}

	// Create a buffer to store shader output (copied from image data)

	const deUint32 imageArea = multiplyComponents(m_imageSize);
	const VkDeviceSize outputBufferSizeBytes = sizeof(deUint32) * imageArea;
	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(outputBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	// Set the bindings

	const VkDescriptorImageInfo imageDescriptorInfo = makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);
	const VkDescriptorBufferInfo bufferDescriptorInfo = makeDescriptorBufferInfo(*inputBuffer, 0ull, inputBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &bufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageDescriptorInfo)
		.update(vk, device);

	// Perform the computation
	{
		const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
		const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
		const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		const VkBufferMemoryBarrier inputBufferPostHostWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, *inputBuffer, 0ull, inputBufferSizeBytes);

		const VkImageMemoryBarrier imageLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
			*image, subresourceRange);

		const VkImageMemoryBarrier imagePreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*image, subresourceRange);

		const VkBufferMemoryBarrier outputBufferPostCopyBarrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, outputBufferSizeBytes);

		const VkBufferImageCopy copyParams = makeBufferImageCopy(m_imageSize);

		// Prepare the command buffer

		const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
		const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		// Start recording commands

		beginCommandBuffer(vk, *cmdBuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &inputBufferPostHostWriteBarrier, 1, &imageLayoutBarrier);
		vk.cmdDispatch(*cmdBuffer, m_imageSize.x(), m_imageSize.y(), 1u);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &imagePreCopyBarrier);
		vk.cmdCopyImageToBuffer(*cmdBuffer, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *outputBuffer, 1u, &copyParams);
		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &outputBufferPostCopyBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

		endCommandBuffer(vk, *cmdBuffer);

		// Wait for completion

		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outputBufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
	const deUint32* refBufferPtr = static_cast<deUint32*>(inputBuffer.getAllocation().getHostPtr());

	for (deUint32 pixelNdx = 0; pixelNdx < imageArea; ++pixelNdx)
	{
		const deUint32	res = bufferPtr[pixelNdx];
		deUint32		ref = 0;

		for (deUint32 offs = 0; offs < m_localSize; ++offs)
			ref += refBufferPtr[pixelNdx * m_localSize + offs];

		if (res != ref)
		{
			std::ostringstream msg;
			msg << "Comparison failed for pixel " << pixelNdx;
			return tcu::TestStatus::fail(msg.str());
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}